

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::DitheringCase::DitheringCase
          (DitheringCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,bool ditheringEnabled,PatternType patternType,Vec4 *color)

{
  int iVar1;
  undefined4 extraout_var;
  PixelFormat *pPVar2;
  bool ditheringEnabled_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  DitheringCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DitheringCase_00caf880;
  this->m_renderCtx = renderCtx;
  this->m_ditheringEnabled = ditheringEnabled;
  this->m_patternType = patternType;
  tcu::Vector<float,_4>::Vector(&this->m_color,color);
  iVar1 = (*renderCtx->_vptr_RenderContext[4])();
  pPVar2 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar1));
  iVar1 = pPVar2->greenBits;
  (this->m_renderFormat).redBits = pPVar2->redBits;
  (this->m_renderFormat).greenBits = iVar1;
  iVar1 = pPVar2->alphaBits;
  (this->m_renderFormat).blueBits = pPVar2->blueBits;
  (this->m_renderFormat).alphaBits = iVar1;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_iteration = 0;
  return;
}

Assistant:

DitheringCase::DitheringCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* const name, const char* const description, const bool ditheringEnabled, const PatternType patternType, const Vec4& color)
	: TestCase				(testCtx, name, description)
	, m_renderCtx			(renderCtx)
	, m_ditheringEnabled	(ditheringEnabled)
	, m_patternType			(patternType)
	, m_color				(color)
	, m_renderFormat		(renderCtx.getRenderTarget().getPixelFormat())
	, m_renderer			(DE_NULL)
	, m_iteration			(0)
{
}